

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# active_info.c
# Opt level: O3

double inform_active_info(int *series,size_t n,size_t m,int b,size_t k,inform_error *err)

{
  int *piVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  long lVar6;
  _Bool _Var7;
  ulong uVar8;
  ulong uVar9;
  void *__ptr;
  ulong uVar10;
  size_t sVar11;
  int iVar12;
  int iVar13;
  long lVar14;
  size_t sVar15;
  long lVar16;
  int future;
  ulong uVar17;
  void *pvVar18;
  double dVar19;
  double dVar20;
  undefined1 auVar21 [16];
  double dVar22;
  undefined1 auVar23 [16];
  double dVar24;
  
  _Var7 = check_arguments(series,n,m,b,k,err);
  dVar19 = NAN;
  if (!_Var7) {
    auVar23._8_4_ = (int)(k >> 0x20);
    auVar23._0_8_ = k;
    auVar23._12_4_ = 0x45300000;
    dVar19 = pow((double)b,
                 (auVar23._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)k) - 4503599627370496.0));
    dVar19 = dVar19 * (double)b;
    uVar8 = (ulong)dVar19;
    uVar8 = (long)(dVar19 - 9.223372036854776e+18) & (long)uVar8 >> 0x3f | uVar8;
    uVar9 = uVar8 / (ulong)(long)b;
    __ptr = calloc((long)b + uVar8 + uVar9,4);
    if (__ptr == (void *)0x0) {
      if (err != (inform_error *)0x0) {
        *err = INFORM_ENOMEM;
      }
      dVar19 = NAN;
    }
    else {
      lVar6 = uVar9 * 4 + uVar8 * 4;
      if (n != 0) {
        sVar11 = 0;
        do {
          if (k == 0) {
            iVar12 = 1;
            iVar13 = 0;
          }
          else {
            sVar15 = 0;
            iVar12 = 1;
            iVar13 = 0;
            do {
              iVar12 = iVar12 * b;
              iVar13 = iVar13 * b + series[sVar15];
              sVar15 = sVar15 + 1;
            } while (k != sVar15);
          }
          if (k < m) {
            lVar16 = 0;
            do {
              iVar2 = series[k + lVar16];
              lVar14 = (long)(iVar13 * b) + (long)iVar2;
              piVar1 = (int *)((long)__ptr + lVar14 * 4);
              *piVar1 = *piVar1 + 1;
              piVar1 = (int *)((long)__ptr + (long)iVar13 * 4 + uVar8 * 4);
              *piVar1 = *piVar1 + 1;
              piVar1 = (int *)((long)__ptr + (long)iVar2 * 4 + lVar6);
              *piVar1 = *piVar1 + 1;
              iVar13 = (int)lVar14 - series[lVar16] * iVar12;
              lVar16 = lVar16 + 1;
            } while (m - k != lVar16);
          }
          sVar11 = sVar11 + 1;
          series = series + m;
        } while (sVar11 != n);
      }
      lVar16 = (m - k) * n;
      auVar21._8_4_ = (int)((ulong)lVar16 >> 0x20);
      auVar21._0_8_ = lVar16;
      auVar21._12_4_ = 0x45300000;
      dVar22 = (auVar21._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)lVar16) - 4503599627370496.0);
      if ((int)(uint)uVar9 < 1) {
        dVar19 = 0.0;
      }
      else {
        dVar19 = 0.0;
        uVar10 = 0;
        pvVar18 = __ptr;
        do {
          uVar3 = *(uint *)((long)__ptr + uVar10 * 4 + uVar8 * 4);
          if (uVar3 != 0 && 0 < b) {
            uVar17 = 0;
            do {
              uVar4 = *(uint *)((long)__ptr + uVar17 * 4 + lVar6);
              if ((uVar4 != 0) && (uVar5 = *(uint *)((long)pvVar18 + uVar17 * 4), uVar5 != 0)) {
                dVar24 = (double)uVar5;
                dVar20 = log2((dVar22 * dVar24) / ((double)uVar4 * (double)uVar3));
                dVar19 = dVar19 + dVar20 * dVar24;
              }
              uVar17 = uVar17 + 1;
            } while ((uint)b != uVar17);
          }
          uVar10 = uVar10 + 1;
          pvVar18 = (void *)((long)pvVar18 + (ulong)(uint)b * 4);
        } while (uVar10 < ((uint)uVar9 & 0x7fffffff));
      }
      dVar19 = dVar19 / dVar22;
      free(__ptr);
    }
  }
  return dVar19;
}

Assistant:

double inform_active_info(int const *series, size_t n, size_t m, int b,
    size_t k, inform_error *err)
{
    if (check_arguments(series, n, m, b, k, err)) return NAN;

    size_t const N = n * (m - k);

    size_t const states_size = (size_t) (b * pow((double) b,(double) k));
    size_t const histories_size = states_size / b;
    size_t const futures_size = b;
    size_t const total_size = states_size + histories_size + futures_size;

    uint32_t *data = calloc(total_size, sizeof(uint32_t));
    if (data == NULL)
    {
        INFORM_ERROR_RETURN(err, INFORM_ENOMEM, NAN);
    }

    inform_dist states    = { data, states_size, N };
    inform_dist histories = { data + states_size, histories_size, N };
    inform_dist futures   = { data + states_size + histories_size, futures_size, N };

    accumulate_observations(series, n, m, b, k, &states, &histories, &futures);

    double ai = 0.0;
    int state;
    double n_state, n_history, n_future;
    for (int history = 0; history < (int) histories_size; ++history)
    {
        n_history = histories.histogram[history];
        if (n_history == 0)
        {
            continue;
        }
        for (int future = 0; future < b; ++future)
        {
            n_future = futures.histogram[future];
            if (n_future == 0)
            {
                continue;
            }
            state = history * b + future;
            n_state = states.histogram[state];
            if (n_state == 0)
            {
                continue;
            }
            ai += n_state * log2((N * n_state) / (n_history * n_future));
        }
    }

    free(data);

    return ai / N;
}